

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_import_free(lysf_ctx *ctx,lysp_import *import)

{
  lysp_ext_instance *local_30;
  lysp_ext_instance *local_20;
  uint64_t c__;
  lysp_import *import_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,import->name);
  lydict_remove(ctx->ctx,import->prefix);
  lydict_remove(ctx->ctx,import->dsc);
  lydict_remove(ctx->ctx,import->ref);
  local_20 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (import->exts == (lysp_ext_instance *)0x0) {
      local_30 = (lysp_ext_instance *)0x0;
    }
    else {
      local_30 = import->exts[-1].exts;
    }
    if (local_30 <= local_20) break;
    lysp_ext_instance_free(ctx,import->exts + (long)local_20);
    local_20 = (lysp_ext_instance *)((long)&local_20->name + 1);
  }
  if (import->exts != (lysp_ext_instance *)0x0) {
    free(&import->exts[-1].exts);
  }
  return;
}

Assistant:

static void
lysp_import_free(struct lysf_ctx *ctx, struct lysp_import *import)
{
    /* imported module is freed directly from the context's list */
    lydict_remove(ctx->ctx, import->name);
    lydict_remove(ctx->ctx, import->prefix);
    lydict_remove(ctx->ctx, import->dsc);
    lydict_remove(ctx->ctx, import->ref);
    FREE_ARRAY(ctx, import->exts, lysp_ext_instance_free);
}